

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O0

void llb_build_value_get_file_infos
               (llb_build_value *value,void *context,
               _func_void_void_ptr_llb_build_value_file_info_t *iterator)

{
  llb_build_value_file_info_t lVar1;
  BuildValue *this;
  FileInfo *__src;
  llb_build_value_file_info_t local_b0;
  undefined1 local_80 [8];
  FileInfo fileInfo;
  uint index;
  uint count;
  BuildValue *internalBuildValue;
  _func_void_void_ptr_llb_build_value_file_info_t *iterator_local;
  void *context_local;
  llb_build_value *value_local;
  
  this = anon_unknown.dwarf_1efc24::CAPIBuildValue::getInternalBuildValue((CAPIBuildValue *)value);
  fileInfo.checksum.bytes._28_4_ = llbuild::buildsystem::BuildValue::getNumOutputs(this);
  fileInfo.checksum.bytes[0x18] = '\0';
  fileInfo.checksum.bytes[0x19] = '\0';
  fileInfo.checksum.bytes[0x1a] = '\0';
  fileInfo.checksum.bytes[0x1b] = '\0';
  for (; (uint)fileInfo.checksum.bytes._24_4_ < (uint)fileInfo.checksum.bytes._28_4_;
      fileInfo.checksum.bytes._24_4_ = fileInfo.checksum.bytes._24_4_ + 1) {
    __src = llbuild::buildsystem::BuildValue::getNthOutputInfo(this,fileInfo.checksum.bytes._24_4_);
    memcpy(local_80,__src,0x50);
    llbuild::capi::convertFileInfo(&local_b0,(FileInfo *)local_80);
    lVar1.inode = local_b0.inode;
    lVar1.device = local_b0.device;
    lVar1.mode = local_b0.mode;
    lVar1.size = local_b0.size;
    lVar1.modTime.seconds = local_b0.modTime.seconds;
    lVar1.modTime.nanoseconds = local_b0.modTime.nanoseconds;
    (*iterator)(context,lVar1);
  }
  return;
}

Assistant:

void llb_build_value_get_file_infos(llb_build_value *_Nonnull value, void *_Nullable context, void (*_Nonnull iterator)(void *_Nullable context, llb_build_value_file_info_t fileInfo)) {
  auto internalBuildValue = &((CAPIBuildValue *)value)->getInternalBuildValue();
  auto count = internalBuildValue->getNumOutputs();
  for (unsigned index = 0; index < count; index++) {
    auto fileInfo = internalBuildValue->getNthOutputInfo(index);
    iterator(context, llbuild::capi::convertFileInfo(fileInfo));
  }
}